

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

void freeStack(Stack stack)

{
  element *__ptr;
  Data data;
  size_t sVar1;
  
  sVar1 = stack->size;
  while (sVar1 != 0) {
    __ptr = stack->top;
    data = __ptr->data;
    stack->top = __ptr->next;
    stack->size = sVar1 - 1;
    free(__ptr);
    deepFreeData(data);
    sVar1 = stack->size;
  }
  free(stack);
  return;
}

Assistant:

void freeStack(Stack stack) {
    while (stack->size) {
        deepFreeData(pop(stack));
    }
    free(stack);
}